

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

ssize_t __thiscall ScrollPanel::read(ScrollPanel *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t sVar2;
  void *__buf_00;
  undefined4 in_register_00000034;
  ScrollBarVisibility local_1c;
  uint8_t *puStack_18;
  int tmp;
  uint8_t *buf_local;
  ScrollPanel *this_local;
  
  puStack_18 = (uint8_t *)CONCAT44(in_register_00000034,__fd);
  buf_local = (uint8_t *)this;
  iVar1 = Util::readFloat32(puStack_18,&this->panelX);
  puStack_18 = puStack_18 + iVar1;
  iVar1 = Util::readFloat32(puStack_18,&this->panelY);
  puStack_18 = puStack_18 + iVar1;
  iVar1 = Util::readFloat32(puStack_18,&this->panelWidth);
  puStack_18 = puStack_18 + iVar1;
  iVar1 = Util::readFloat32(puStack_18,&this->panelHeight);
  puStack_18 = puStack_18 + iVar1;
  iVar1 = Util::readBool(puStack_18,&this->horizontalScroll);
  puStack_18 = puStack_18 + iVar1;
  iVar1 = Util::readBool(puStack_18,&this->verticalScroll);
  puStack_18 = puStack_18 + iVar1;
  iVar1 = Util::readInt32(puStack_18,(int *)&local_1c);
  puStack_18 = puStack_18 + iVar1;
  this->scrollBarVisibility = local_1c;
  iVar1 = Util::readString(puStack_18,&this->panelName);
  puStack_18 = puStack_18 + iVar1;
  sVar2 = Widget::read(&this->super_Widget,(int)puStack_18,__buf_00,(long)iVar1);
  return sVar2;
}

Assistant:

uint8_t* ScrollPanel::read(uint8_t* buf)
{
	buf += Util::readFloat32(buf, panelX);
	buf += Util::readFloat32(buf, panelY);
	buf += Util::readFloat32(buf, panelWidth);
	buf += Util::readFloat32(buf, panelHeight);
	buf += Util::readBool(buf, horizontalScroll);
	buf += Util::readBool(buf, verticalScroll);
	int tmp;
	buf += Util::readInt32(buf, tmp);
	scrollBarVisibility = static_cast<ScrollBarVisibility>(tmp);
	buf += Util::readString(buf, panelName);
	return Widget::read(buf);
}